

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void __thiscall Z80::OpCode_MULUW(Z80 *this)

{
  bool bVar1;
  Z80Reg ZVar2;
  char **p;
  int local_c [3];
  
  local_c[2] = 0xffffffff;
  local_c[0] = -1;
  local_c[1] = -1;
  ZVar2 = GetRegister((char **)this);
  if (ZVar2 == Z80_HL) {
    p = &lp;
    bVar1 = comma(&lp);
    ZVar2 = Z80_HL;
    if (bVar1) {
      ZVar2 = GetRegister(p);
    }
  }
  if (ZVar2 == Z80_BC) {
    local_c[1] = 0xc3;
  }
  else {
    if (ZVar2 != Z80_SP) goto LAB_0013991e;
    local_c[1] = 0xf3;
  }
  local_c[0] = 0xed;
LAB_0013991e:
  EmitBytes(local_c,true);
  return;
}

Assistant:

static void OpCode_MULUW() {
		Z80Reg reg;
		int e[3];
		e[0] = e[1] = e[2] = -1;
		if ((reg = GetRegister(lp)) == Z80_HL && comma(lp)) {
			reg = GetRegister(lp);
		}
		switch (reg) {
		case Z80_BC:
			e[0] = 0xed; e[1] = 0xc3; break;
		case Z80_SP:
			e[0] = 0xed; e[1] = 0xf3; break;
		default:
			;
		}
		EmitBytes(e, true);
	}